

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall PrimitiveTestClass::AddValues(PrimitiveTestClass *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char *pcVar4;
  uchar *puVar5;
  short *psVar6;
  unsigned_short *puVar7;
  int *piVar8;
  uint *puVar9;
  long *plVar10;
  unsigned_long *puVar11;
  longlong *plVar12;
  unsigned_long_long *puVar13;
  float *pfVar14;
  double *pdVar15;
  longdouble *plVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  element_type *peVar20;
  element_type *peVar21;
  TestArrObj *pTVar22;
  ulong uVar23;
  TestArrObj *local_98;
  TestArrObj *local_70;
  ulong local_50;
  size_t i_2;
  shared_ptr<TestArrObj> local_40;
  ulong local_30;
  size_t i_1;
  ulong local_18;
  size_t i;
  PrimitiveTestClass *this_local;
  
  this->c = -1;
  this->uc = 0xff;
  this->s = -1;
  this->us = 0xffff;
  this->i = 0xfffff;
  this->ui = 0xfffff;
  this->l = 0xfffff;
  this->ul = 0xfffff;
  this->ll = 0xfffff;
  this->ull = 0xfffff;
  this->f = 1.342323;
  this->d = 432.324324324;
  this->ld = (longdouble)423432.3465435435;
  i = (size_t)this;
  pcVar4 = (char *)operator_new__(0xd);
  this->str = pcVar4;
  strcpy(this->str,"Hello World!");
  this->str[0xc] = '\0';
  pcVar4 = FillValues<char*>(this);
  this->pc = pcVar4;
  puVar5 = FillValues<unsigned_char*>(this);
  this->puc = puVar5;
  psVar6 = FillValues<short*>(this);
  this->ps = psVar6;
  puVar7 = FillValues<unsigned_short*>(this);
  this->pus = puVar7;
  piVar8 = FillValues<int*>(this);
  this->pi = piVar8;
  puVar9 = FillValues<unsigned_int*>(this);
  this->pui = puVar9;
  plVar10 = FillValues<long*>(this);
  this->pl = plVar10;
  puVar11 = FillValues<unsigned_long*>(this);
  this->pul = puVar11;
  plVar12 = FillValues<long_long*>(this);
  this->pll = plVar12;
  puVar13 = FillValues<unsigned_long_long*>(this);
  this->pull = puVar13;
  pfVar14 = FillValues<float*>(this);
  this->pf = pfVar14;
  pdVar15 = FillValues<double*>(this);
  this->pd = pdVar15;
  plVar16 = FillValues<long_double*>(this);
  this->pld = plVar16;
  uVar17 = (ulong)this->SIZE;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar17;
  uVar18 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar23 = uVar18 + 8;
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar18) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar19 = (ulong *)operator_new__(uVar23);
  *puVar19 = uVar17;
  pTVar22 = (TestArrObj *)(puVar19 + 1);
  if (uVar17 != 0) {
    local_70 = pTVar22;
    do {
      TestArrObj::TestArrObj(local_70);
      local_70 = local_70 + 1;
    } while (local_70 != pTVar22 + uVar17);
  }
  this->pto = pTVar22;
  for (local_18 = 0; local_18 < (ulong)(long)this->SIZE; local_18 = local_18 + 1) {
    TestArrObj::SetVal(this->pto + local_18);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar17);
  std::shared_ptr<int>::shared_ptr<int,void>((shared_ptr<int> *)&i_1,piVar8);
  std::shared_ptr<int>::operator=(&this->spi,(shared_ptr<int> *)&i_1);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&i_1);
  for (local_30 = 0; local_30 < (ulong)(long)this->SIZE; local_30 = local_30 + 1) {
    peVar20 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                        ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &this->spi);
    peVar20[local_30] = 10;
  }
  uVar17 = (ulong)this->SIZE;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar17;
  uVar18 = SUB168(auVar3 * ZEXT816(0x20),0);
  uVar23 = uVar18 + 8;
  if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar18) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar19 = (ulong *)operator_new__(uVar23);
  *puVar19 = uVar17;
  pTVar22 = (TestArrObj *)(puVar19 + 1);
  if (uVar17 != 0) {
    local_98 = pTVar22;
    do {
      TestArrObj::TestArrObj(local_98);
      local_98 = local_98 + 1;
    } while (local_98 != pTVar22 + uVar17);
  }
  std::shared_ptr<TestArrObj>::shared_ptr<TestArrObj,std::default_delete<TestArrObj[]>,void>
            (&local_40,pTVar22);
  std::shared_ptr<TestArrObj>::operator=(&this->spto,&local_40);
  std::shared_ptr<TestArrObj>::~shared_ptr(&local_40);
  for (local_50 = 0; local_50 < (ulong)(long)this->SIZE; local_50 = local_50 + 1) {
    peVar21 = std::__shared_ptr_access<TestArrObj,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<TestArrObj,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->spto);
    TestArrObj::SetVal(peVar21 + local_50);
  }
  return;
}

Assistant:

void AddValues()
        {
            c = 0xFF;
            uc = 0xFF;
            s = 0xFFFF;
            us = 0xFFFF;
            i = 0xFFFFF;
            ui = 0xFFFFF;
            l = 0xFFFFF;
            ul = 0xFFFFF;
            ll = 0xFFFFF;
            ull = 0xFFFFF;
            f = 1.342323;
            d = 432.324324324;
            ld = 423432.3465435435;

            str = new char[strlen("Hello World!") + 1];
            strcpy(str, "Hello World!");
            str[strlen("Hello World!")] = '\0';

            pc = FillValues<char *>();
            puc = FillValues<unsigned char *>();
            ps = FillValues<short *>();
            pus = FillValues<unsigned short *>();
            pi = FillValues<int *>();
            pui = FillValues<unsigned int *>();
            pl = FillValues<long *>();
            pul = FillValues<unsigned long *>();
            pll = FillValues<long long *>();
            pull = FillValues<unsigned long long *>();
            pf = FillValues<float *>();
            pd = FillValues<double *>();
            pld = FillValues<long double *>();

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i].SetVal();
            }
            
            spi = shared_ptr<int>(new int[SIZE]);
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spi)[i] = 10;
            }

            spto = shared_ptr<TestArrObj>(new TestArrObj[SIZE], default_delete<TestArrObj[]>());
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spto)[i].SetVal();
            }   
        }